

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonArrayLengthFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  u32 uVar1;
  JsonParse *pJVar2;
  sqlite3_context *ctx_00;
  int in_ESI;
  undefined8 in_RDI;
  sqlite3_value *unaff_retaddr;
  undefined4 in_stack_00000008;
  u32 in_stack_0000000c;
  char *zPath;
  u8 eErr;
  u32 i;
  sqlite3_int64 cnt;
  JsonParse *p;
  char *in_stack_ffffffffffffffb8;
  JsonParse *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  u32 iRoot;
  uint3 in_stack_ffffffffffffffd0;
  uint uVar3;
  
  iRoot = (u32)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  uVar3 = (uint)in_stack_ffffffffffffffd0;
  pJVar2 = jsonParseFuncArg((sqlite3_context *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                            unaff_retaddr,(u32)((ulong)in_RDI >> 0x20));
  if (pJVar2 != (JsonParse *)0x0) {
    if (in_ESI == 2) {
      ctx_00 = (sqlite3_context *)sqlite3_value_text((sqlite3_value *)0x22f9ba);
      if (ctx_00 == (sqlite3_context *)0x0) {
        jsonParseFree((JsonParse *)0x22f9d1);
        return;
      }
      if (*(uchar *)&ctx_00->pOut == '$') {
        in_stack_ffffffffffffffb8 = (char *)((long)&ctx_00->pOut + 1);
      }
      else {
        in_stack_ffffffffffffffb8 = "@";
      }
      in_stack_ffffffffffffffc0 = pJVar2;
      uVar1 = jsonLookupStep((JsonParse *)cnt,i,zPath,in_stack_0000000c);
      if (0xfffffffc < uVar1) {
        if (uVar1 != 0xfffffffe) {
          if (uVar1 == 0xfffffffd) {
            jsonBadPathError(ctx_00,(char *)in_stack_ffffffffffffffc0);
          }
          else {
            sqlite3_result_error
                      ((sqlite3_context *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
          }
        }
        uVar3 = CONCAT13(1,(int3)uVar3);
        uVar1 = 0;
      }
      iRoot = (u32)((ulong)ctx_00 >> 0x20);
    }
    else {
      uVar1 = 0;
    }
    if ((pJVar2->aBlob[uVar1] & 0xf) == 0xb) {
      jsonbArrayCount((JsonParse *)CONCAT44(uVar1,uVar3),iRoot);
    }
    if ((char)(uVar3 >> 0x18) == '\0') {
      sqlite3_result_int64
                ((sqlite3_context *)in_stack_ffffffffffffffc0,(i64)in_stack_ffffffffffffffb8);
    }
    jsonParseFree((JsonParse *)0x22fac3);
  }
  return;
}

Assistant:

static void jsonArrayLengthFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  sqlite3_int64 cnt = 0;
  u32 i;
  u8 eErr = 0;

  p = jsonParseFuncArg(ctx, argv[0], 0);
  if( p==0 ) return;
  if( argc==2 ){
    const char *zPath = (const char*)sqlite3_value_text(argv[1]);
    if( zPath==0 ){
      jsonParseFree(p);
      return;
    }
    i = jsonLookupStep(p, 0, zPath[0]=='$' ? zPath+1 : "@", 0);
    if( JSON_LOOKUP_ISERROR(i) ){
      if( i==JSON_LOOKUP_NOTFOUND ){
        /* no-op */
      }else if( i==JSON_LOOKUP_PATHERROR ){
        jsonBadPathError(ctx, zPath);
      }else{
        sqlite3_result_error(ctx, "malformed JSON", -1);
      }
      eErr = 1;
      i = 0;
    }
  }else{
    i = 0;
  }
  if( (p->aBlob[i] & 0x0f)==JSONB_ARRAY ){
    cnt = jsonbArrayCount(p, i);
  }
  if( !eErr ) sqlite3_result_int64(ctx, cnt);
  jsonParseFree(p);
}